

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O0

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::synchronize
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,optional<double> t_min,double *t_sync
          ,optional<unsigned_long> *limiting_dof,Vector<Profile> *profiles,bool discrete_duration,
          double delta_time)

{
  _Storage<unsigned_long,_true> _Var1;
  array<ruckig::Profile,_3UL> *paVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  Interval *pIVar9;
  iterator pvVar10;
  _Storage<unsigned_long,_true> *p_Var11;
  div_t dVar12;
  unsigned_long *puVar13;
  reference pvVar14;
  double dVar15;
  byte local_139;
  iterator local_138;
  bool local_119;
  value_type_conflict2 local_118;
  value_type_conflict2 local_108;
  ldiv_t div;
  double local_c8;
  ulong local_c0;
  size_t dof_1;
  _Storage<unsigned_long,_true> _Stack_b0;
  bool is_blocked;
  double possible_t_sync_1;
  iterator i;
  iterator local_98;
  iterator idx_end;
  double remainder;
  value_type_conflict2 *possible_t_sync;
  iterator __end0;
  iterator __begin0;
  StandardVectorIntervals<double> *__range3;
  ulong local_60;
  size_t dof;
  double dStack_50;
  bool any_interval;
  double delta_time_local;
  Vector<Profile> *pVStack_40;
  bool discrete_duration_local;
  Vector<Profile> *profiles_local;
  optional<unsigned_long> *limiting_dof_local;
  double *t_sync_local;
  TargetCalculator<3UL,_ruckig::StandardVector> *this_local;
  optional<double> t_min_local;
  
  this_local = t_min.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
  t_min_local.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload._0_1_ =
       t_min.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged;
  dof._7_1_ = 0;
  dStack_50 = delta_time;
  delta_time_local._7_1_ = discrete_duration;
  pVStack_40 = profiles;
  profiles_local = (Vector<Profile> *)limiting_dof;
  limiting_dof_local = (optional<unsigned_long> *)t_sync;
  t_sync_local = (double *)this;
  for (local_60 = 0; local_60 < this->degrees_of_freedom; local_60 = local_60 + 1) {
    pvVar6 = std::array<ruckig::Synchronization,_3UL>::operator[]
                       (&this->inp_per_dof_synchronization,local_60);
    if (*pvVar6 == None) {
      pvVar7 = std::array<double,_10UL>::operator[](&this->possible_t_syncs,local_60);
      *pvVar7 = 0.0;
      dVar15 = std::numeric_limits<double>::infinity();
      pvVar7 = std::array<double,_10UL>::operator[]
                         (&this->possible_t_syncs,this->degrees_of_freedom + local_60);
      *pvVar7 = dVar15;
      dVar15 = std::numeric_limits<double>::infinity();
      pvVar7 = std::array<double,_10UL>::operator[]
                         (&this->possible_t_syncs,this->degrees_of_freedom * 2 + local_60);
      *pvVar7 = dVar15;
    }
    else {
      pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
      dVar15 = pvVar8->t_min;
      pvVar7 = std::array<double,_10UL>::operator[](&this->possible_t_syncs,local_60);
      *pvVar7 = dVar15;
      pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&pvVar8->a);
      if (bVar3) {
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
        pIVar9 = std::optional<ruckig::Block::Interval>::operator->(&pvVar8->a);
        local_108 = *(value_type_conflict2 *)(pIVar9 + 8);
      }
      else {
        local_108 = std::numeric_limits<double>::infinity();
      }
      pvVar7 = std::array<double,_10UL>::operator[]
                         (&this->possible_t_syncs,this->degrees_of_freedom + local_60);
      *pvVar7 = local_108;
      pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&pvVar8->b);
      if (bVar3) {
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
        pIVar9 = std::optional<ruckig::Block::Interval>::operator->(&pvVar8->b);
        local_118 = *(value_type_conflict2 *)(pIVar9 + 8);
      }
      else {
        local_118 = std::numeric_limits<double>::infinity();
      }
      pvVar7 = std::array<double,_10UL>::operator[]
                         (&this->possible_t_syncs,this->degrees_of_freedom * 2 + local_60);
      *pvVar7 = local_118;
      pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&pvVar8->a);
      local_119 = true;
      if (!bVar3) {
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_60);
        local_119 = std::optional::operator_cast_to_bool((optional *)&pvVar8->b);
      }
      dof._7_1_ = (dof._7_1_ & 1) != 0 || local_119 != false;
    }
  }
  __range3 = (StandardVectorIntervals<double> *)std::numeric_limits<double>::infinity();
  dVar15 = std::optional<double>::value_or<double>
                     ((optional<double> *)&this_local,(double *)&__range3);
  pvVar7 = std::array<double,_10UL>::operator[]
                     (&this->possible_t_syncs,this->degrees_of_freedom * 3);
  *pvVar7 = dVar15;
  bVar3 = std::optional<double>::has_value((optional<double> *)&this_local);
  dof._7_1_ = (dof._7_1_ & 1) != 0 || bVar3;
  if ((delta_time_local._7_1_ & 1) != 0) {
    __begin0 = (this->possible_t_syncs)._M_elems;
    __end0 = std::array<double,_10UL>::begin((array<double,_10UL> *)__begin0);
    possible_t_sync = std::array<double,_10UL>::end((array<double,_10UL> *)__begin0);
    for (; __end0 != possible_t_sync; __end0 = __end0 + 1) {
      remainder = (double)__end0;
      uVar4 = std::isinf(*__end0);
      if (((uVar4 & 1) == 0) &&
         (idx_end = (iterator)fmod(*(double *)remainder,dStack_50),
         2.220446049250313e-16 < (double)idx_end)) {
        *(double *)remainder = (dStack_50 - (double)idx_end) + *(double *)remainder;
      }
    }
  }
  if ((dof._7_1_ & 1) == 0) {
    local_138 = std::array<unsigned_long,_10UL>::begin(&this->idx);
    local_138 = local_138 + this->degrees_of_freedom;
  }
  else {
    local_138 = std::array<unsigned_long,_10UL>::end(&this->idx);
  }
  local_98 = local_138;
  pvVar10 = std::array<unsigned_long,_10UL>::begin(&this->idx);
  std::iota<unsigned_long*,int>(pvVar10,local_98,0);
  pvVar10 = std::array<unsigned_long,_10UL>::begin(&this->idx);
  i = (iterator)this;
  std::
  sort<unsigned_long*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>
            (pvVar10,local_98,(anon_class_8_1_8991fb9c)this);
  pvVar10 = std::array<unsigned_long,_10UL>::begin(&this->idx);
  possible_t_sync_1 = (double)(pvVar10 + (this->degrees_of_freedom - 1));
  do {
    if ((iterator)possible_t_sync_1 == local_98) {
      return false;
    }
    p_Var11 = (_Storage<unsigned_long,_true> *)
              std::array<double,_10UL>::operator[]
                        (&this->possible_t_syncs,*(size_type *)possible_t_sync_1);
    _Stack_b0 = *p_Var11;
    dof_1._7_1_ = 0;
    for (local_c0 = 0; local_c0 < this->degrees_of_freedom; local_c0 = local_c0 + 1) {
      pvVar6 = std::array<ruckig::Synchronization,_3UL>::operator[]
                         (&this->inp_per_dof_synchronization,local_c0);
      if (*pvVar6 != None) {
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,local_c0);
        bVar3 = Block::is_blocked(pvVar8,(double)_Stack_b0);
        if (bVar3) {
          dof_1._7_1_ = 1;
          break;
        }
      }
    }
    _Var1 = _Stack_b0;
    local_139 = 1;
    if ((dof_1._7_1_ & 1) == 0) {
      local_c8 = 0.0;
      dVar15 = std::optional<double>::value_or<double>((optional<double> *)&this_local,&local_c8);
      local_139 = 1;
      if (dVar15 <= (double)_Var1) {
        iVar5 = std::isinf((double)_Stack_b0);
        local_139 = (byte)iVar5;
      }
    }
    if ((local_139 & 1) == 0) {
      (limiting_dof_local->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload = _Stack_b0;
      if (*(long *)possible_t_sync_1 == this->degrees_of_freedom * 3) {
        std::optional<unsigned_long>::operator=((optional<unsigned_long> *)profiles_local);
        return true;
      }
      dVar12 = std::div((int)*(undefined8 *)possible_t_sync_1,(int)this->degrees_of_freedom);
      std::optional<unsigned_long>::operator=((optional<unsigned_long> *)profiles_local,&div.quot);
      if (dVar12 == (div_t)0x0) {
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,*puVar13);
        paVar2 = pVStack_40;
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar14 = std::array<ruckig::Profile,_3UL>::operator[](paVar2,*puVar13);
        memcpy(pvVar14,pvVar8,0x23c);
      }
      else if (dVar12 == (div_t)0x1) {
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,*puVar13);
        pIVar9 = std::optional<ruckig::Block::Interval>::operator->(&pvVar8->a);
        paVar2 = pVStack_40;
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar14 = std::array<ruckig::Profile,_3UL>::operator[](paVar2,*puVar13);
        memcpy(pvVar14,pIVar9 + 0x10,0x23c);
      }
      else if (dVar12 == (div_t)0x2) {
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar8 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,*puVar13);
        pIVar9 = std::optional<ruckig::Block::Interval>::operator->(&pvVar8->b);
        paVar2 = pVStack_40;
        puVar13 = std::optional<unsigned_long>::value((optional<unsigned_long> *)profiles_local);
        pvVar14 = std::array<ruckig::Profile,_3UL>::operator[](paVar2,*puVar13);
        memcpy(pvVar14,pIVar9 + 0x10,0x23c);
      }
      return true;
    }
    possible_t_sync_1 = (double)((long)possible_t_sync_1 + 8);
  } while( true );
}

Assistant:

bool synchronize(std::optional<double> t_min, double& t_sync, std::optional<size_t>& limiting_dof, Vector<Profile>& profiles, bool discrete_duration, double delta_time) {
        // Check for (degrees_of_freedom == 1 && !t_min && !discrete_duration) is now outside

        // Possible t_syncs are the start times of the intervals and optional t_min
        bool any_interval {false};
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            // Ignore DoFs without synchronization here
            if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                possible_t_syncs[dof] = 0.0;
                possible_t_syncs[degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                possible_t_syncs[2 * degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                continue;
            }

            possible_t_syncs[dof] = blocks[dof].t_min;
            possible_t_syncs[degrees_of_freedom + dof] = blocks[dof].a ? blocks[dof].a->right : std::numeric_limits<double>::infinity();
            possible_t_syncs[2 * degrees_of_freedom + dof] = blocks[dof].b ? blocks[dof].b->right : std::numeric_limits<double>::infinity();
            any_interval |= blocks[dof].a || blocks[dof].b;
        }
        possible_t_syncs[3 * degrees_of_freedom] = t_min.value_or(std::numeric_limits<double>::infinity());
        any_interval |= t_min.has_value();

        if (discrete_duration) {
            for (auto& possible_t_sync: possible_t_syncs) {
                if (std::isinf(possible_t_sync)) {
                    continue;
                }

                const double remainder = std::fmod(possible_t_sync, delta_time); // in [0, delta_time)
                if (remainder > eps) {
                    possible_t_sync += delta_time - remainder;
                }
            }
        }

        // Test them in sorted order
        auto idx_end = any_interval ? idx.end() : idx.begin() + degrees_of_freedom;
        std::iota(idx.begin(), idx_end, 0);
        std::sort(idx.begin(), idx_end, [&](size_t i, size_t j) { return possible_t_syncs[i] < possible_t_syncs[j]; });

        // Start at last tmin (or worse)
        for (auto i = idx.begin() + degrees_of_freedom - 1; i != idx_end; ++i) {
            const double possible_t_sync = possible_t_syncs[*i];
            bool is_blocked {false};
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                    continue; // inner dof loop
                }
                if (blocks[dof].is_blocked(possible_t_sync)) {
                    is_blocked = true;
                    break; // inner dof loop
                }
            }
            if (is_blocked || possible_t_sync < t_min.value_or(0.0) || std::isinf(possible_t_sync)) {
                continue;
            }

            t_sync = possible_t_sync;
            if (*i == 3*degrees_of_freedom) { // Optional t_min
                limiting_dof = std::nullopt;
                return true;
            }

            const auto div = std::div(static_cast<long>(*i), static_cast<long>(degrees_of_freedom));
            limiting_dof = div.rem;
            switch (div.quot) {
                case 0: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].p_min;
                } break;
                case 1: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].a->profile;
                } break;
                case 2: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].b->profile;
                } break;
            }
            return true;
        }

        return false;
    }